

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_collector.cpp
# Opt level: O0

bool __thiscall
skiwi::anon_unknown_2::quote_collector_visitor::_previsit(quote_collector_visitor *this,Quote *q)

{
  mapped_type *this_00;
  cell *pcVar1;
  key_type local_1d0;
  stringstream local_1a0 [8];
  stringstream str;
  ostream local_190 [376];
  Quote *local_18;
  Quote *q_local;
  quote_collector_visitor *this_local;
  
  local_18 = q;
  q_local = (Quote *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  operator<<(local_190,&local_18->arg);
  pcVar1 = &local_18->arg;
  std::__cxx11::stringstream::str();
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
            ::operator[](&this->collected_quotes,&local_1d0);
  cell::operator=(this_00,pcVar1);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return true;
}

Assistant:

virtual bool _previsit(Quote& q)
      {
      std::stringstream str;
      str << q.arg;
      collected_quotes[str.str()] = q.arg;
      return true;
      }